

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::do_actual_learning<false>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  pointer ppeVar3;
  action_score *paVar4;
  v_array<ACTION_SCORE::action_score> *pvVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  action_score *paVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  uint uVar14;
  vw_exception *this;
  long lVar15;
  example *peVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t uVar19;
  size_t k;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong start_K;
  size_t sVar23;
  float fVar24;
  float fVar25;
  multi_ex ec_seq;
  stringstream __msg;
  multi_ex local_200;
  v_array<v_array<ACTION_SCORE::action_score>_> *local_1e8;
  v_array<ACTION_SCORE::action_score> *local_1e0;
  string local_1d8;
  action_score local_1b8 [2];
  ostream local_1a8;
  
  ppeVar3 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppeVar3) {
    return;
  }
  data->ft_offset = ((*ppeVar3)->super_example_predict).ft_offset;
  process_labels(&local_200,data,ec_seq_all);
  ppeVar3 = local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar20 = (long)local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar20 != 0) {
    bVar13 = ec_seq_has_label_definition(&local_200);
    if (bVar13) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"error: label definition encountered in data block",0x31);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                 ,0x1b6,&local_1d8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    bVar13 = COST_SENSITIVE::ec_is_example_header(*ppeVar3);
    uVar21 = lVar20 >> 3;
    uVar14 = (uint)uVar21;
    start_K = 0;
    if ((bVar13) && (start_K = 1, 1 < uVar14)) {
      uVar17 = 1;
      do {
        LabelDict::add_example_namespaces_from_example
                  (local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17],
                   *local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
        uVar17 = uVar17 + 1;
      } while ((uVar21 & 0xffffffff) != uVar17);
    }
    uVar22 = (uint)start_K;
    test_ldf_sequence(data,start_K,&local_200);
    uVar17 = start_K;
    if (data->rank == false) {
      if (uVar22 < uVar14) {
        fVar25 = 3.4028235e+38;
        sVar23 = start_K;
        do {
          peVar16 = local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar23];
          make_single_prediction(data,base,peVar16);
          fVar24 = peVar16->partial_prediction;
          if (fVar24 < fVar25) {
            uVar17 = sVar23 & 0xffffffff;
            fVar25 = fVar24;
          }
          sVar23 = sVar23 + 1;
        } while (uVar14 != (uint)sVar23);
      }
    }
    else {
      local_1e0 = &data->a_s;
      v_array<ACTION_SCORE::action_score>::clear(local_1e0);
      local_1e8 = &data->stored_preds;
      v_array<v_array<ACTION_SCORE::action_score>_>::clear(local_1e8);
      if (bVar13) {
        v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                  (local_1e8,
                   (v_array<ACTION_SCORE::action_score> *)
                   &((*local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->pred).scalars);
      }
      if (uVar22 < uVar14) {
        uVar18 = (ulong)(uVar22 * 8);
        uVar19 = 0;
        do {
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (local_1e8,
                     (v_array<ACTION_SCORE::action_score> *)
                     (*(long *)((long)local_200.
                                      super__Vector_base<example_*,_std::allocator<example_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + uVar18) + 0x6850));
          peVar16 = *(example **)
                     ((long)local_200.super__Vector_base<example_*,_std::allocator<example_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar18);
          make_single_prediction(data,base,peVar16);
          local_1b8[0].score = peVar16->partial_prediction;
          local_1b8[0].action = uVar19;
          v_array<ACTION_SCORE::action_score>::push_back(local_1e0,local_1b8);
          uVar19 = uVar19 + 1;
          uVar18 = uVar18 + 8;
        } while (uVar14 - uVar22 != uVar19);
      }
      paVar4 = (data->a_s)._begin;
      qsort(paVar4,(long)(data->a_s)._end - (long)paVar4 >> 3,8,ACTION_SCORE::score_comp);
    }
    if (data->rank == false) {
      uVar18 = start_K;
      if (start_K < (uVar21 & 0xffffffff)) {
        do {
          if (uVar17 == uVar18) {
            peVar16 = local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar17];
            fVar25 = (float)((peVar16->l).cs.costs._begin)->class_index;
          }
          else {
            peVar16 = local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar18];
            fVar25 = 0.0;
          }
          (peVar16->pred).scalar = fVar25;
          uVar18 = uVar18 + 1;
        } while ((uVar21 & 0xffffffff) != uVar18);
      }
    }
    else {
      v_array<ACTION_SCORE::action_score>::clear((data->stored_preds)._begin);
      if (bVar13) {
        pvVar5 = (data->stored_preds)._begin;
        peVar16 = *local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        paVar4 = pvVar5->_begin;
        paVar10 = pvVar5->_end;
        uVar7 = *(undefined4 *)((long)&pvVar5->end_array + 4);
        sVar23 = pvVar5->erase_count;
        uVar8 = *(undefined4 *)((long)&pvVar5->erase_count + 4);
        *(undefined4 *)((long)&peVar16->pred + 0x10) = *(undefined4 *)&pvVar5->end_array;
        *(undefined4 *)((long)&peVar16->pred + 0x14) = uVar7;
        *(int *)((long)&peVar16->pred + 0x18) = (int)sVar23;
        *(undefined4 *)((long)&peVar16->pred + 0x1c) = uVar8;
        (peVar16->pred).scalars._begin = (float *)paVar4;
        (peVar16->pred).scalars._end = (float *)paVar10;
      }
      lVar20 = (uVar21 & 0xffffffff) - start_K;
      if (start_K <= (uVar21 & 0xffffffff) && lVar20 != 0) {
        lVar15 = 0;
        do {
          pvVar5 = (data->stored_preds)._begin;
          lVar6 = *(long *)((long)local_200.
                                  super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar15 + (ulong)(uVar22 * 8));
          puVar1 = (undefined8 *)((long)&pvVar5->_begin + lVar15 * 4 + (ulong)(uVar22 << 5));
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar2 = (undefined4 *)((long)&pvVar5->end_array + lVar15 * 4 + (ulong)(uVar22 << 5));
          uVar7 = puVar2[1];
          uVar8 = puVar2[2];
          uVar9 = puVar2[3];
          *(undefined4 *)(lVar6 + 0x6860) = *puVar2;
          *(undefined4 *)(lVar6 + 0x6864) = uVar7;
          *(undefined4 *)(lVar6 + 0x6868) = uVar8;
          *(undefined4 *)(lVar6 + 0x686c) = uVar9;
          *(undefined8 *)(lVar6 + 0x6850) = uVar11;
          *(undefined8 *)(lVar6 + 0x6858) = uVar12;
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)
                     &((*local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->pred).scalars,
                     (action_score *)((long)&((data->a_s)._begin)->action + lVar15));
          lVar15 = lVar15 + 8;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
    }
    if ((bVar13) && (1 < (uVar21 & 0xffffffff))) {
      uVar17 = 1;
      do {
        LabelDict::del_example_namespaces_from_example
                  (local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17],
                   *local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
        uVar17 = uVar17 + 1;
      } while ((uVar21 & 0xffffffff) != uVar17);
    }
    if ((data->is_probabilities != false) && (uVar21 = uVar21 & 0xffffffff, start_K < uVar21)) {
      fVar25 = 0.0;
      sVar23 = start_K;
      do {
        fVar24 = expf(local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start[sVar23]->partial_prediction);
        fVar24 = 1.0 / (fVar24 + 1.0);
        (local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_start[sVar23]->pred).scalar = fVar24;
        fVar25 = fVar25 + fVar24;
        sVar23 = sVar23 + 1;
      } while (uVar21 != sVar23);
      if (uVar14 <= uVar22) goto LAB_00248cbd;
      do {
        (local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_start[start_K]->pred).scalar =
             (local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start[start_K]->pred).scalar / fVar25;
        start_K = start_K + 1;
      } while (uVar21 != start_K);
    }
  }
  if (local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return;
  }
LAB_00248cbd:
  operator_delete(local_200.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();
  uint32_t start_K = 0;

  if (ec_is_example_header(*ec_seq[0]))
  {
    start_K = 1;
    for (uint32_t k = 1; k < K; k++) LabelDict::add_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);
  }
  bool isTest = test_ldf_sequence(data, start_K, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = start_K;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    if (start_K > 0)
      data.stored_preds.push_back(ec_seq[0]->pred.a_s);
    for (uint32_t k = start_K; k < K; k++)
    {
      data.stored_preds.push_back(ec_seq[k]->pred.a_s);
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k - start_K;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = start_K; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, start_K, ec_seq);
    else
      do_actual_learning_oaa(data, base, start_K, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    if (start_K > 0)
    {
      ec_seq[0]->pred.a_s = data.stored_preds[0];
    }
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k - start_K]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = start_K; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }
  /////////////////////// remove header
  if (start_K > 0)
    for (size_t k = 1; k < K; k++) LabelDict::del_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (size_t k = start_K; k < K; k++)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(ec_seq[k]->partial_prediction));
      ec_seq[k]->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.prob /= sum_prob;
    }
  }
}